

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

int __thiscall
duckdb::Interpolator<false>::Operation<int,int,duckdb::MadAccessor<int,int,int>>
          (Interpolator<false> *this,int *v_t,Vector *result,MadAccessor<int,_int,_int> *accessor)

{
  idx_t iVar1;
  long lVar2;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<int,_int,_int>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<int,_int,_int>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<int,_int,_int>_>_> __comp_01;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  uint uVar8;
  idx_t iVar9;
  undefined1 auVar10 [12];
  int result_1;
  int local_44;
  string local_40;
  
  bVar4 = this->desc;
  iVar7 = this->CRN;
  iVar9 = this->FRN;
  iVar1 = this->begin;
  iVar6 = this->end;
  local_40._M_dataplus._M_p = (pointer)accessor;
  local_40._M_string_length = (size_type)accessor;
  local_40.field_2._M_local_buf[0] = bVar4;
  if (iVar7 == iVar9) {
    if (iVar7 != iVar6 && iVar1 != iVar6) {
      uVar5 = (long)(iVar6 * 4 + iVar1 * -4) >> 2;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar4;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<int,int,int>>>>
                (v_t + iVar1,v_t + iVar7,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar7 = this->FRN;
    }
    uVar8 = v_t[iVar7] - *accessor->median;
    if ((int)uVar8 < 1) {
      uVar8 = -uVar8;
    }
    bVar4 = TryCast::Operation<int,int>(uVar8,&local_44,false);
    if (!bVar4) {
      auVar10 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_40,(duckdb *)(ulong)uVar8,auVar10._8_4_);
      InvalidInputException::InvalidInputException(auVar10._0_8_,&local_40);
      __cxa_throw(auVar10._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar9 != iVar6 && iVar1 != iVar6) {
      uVar5 = (long)(iVar6 * 4 + iVar1 * -4) >> 2;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar4;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<int,int,int>>>>
                (v_t + iVar1,v_t + iVar9,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar9 = this->FRN;
      iVar7 = this->CRN;
      iVar6 = this->end;
    }
    local_40._M_dataplus._M_p = (pointer)accessor;
    local_40._M_string_length = (size_type)accessor;
    local_40.field_2._M_local_buf[0] = bVar4;
    if (iVar7 != iVar6 && iVar9 != iVar6) {
      uVar5 = (long)(iVar6 * 4 + iVar9 * -4) >> 2;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar4;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<int,int,int>>>>
                (v_t + iVar9,v_t + iVar7,v_t + iVar6,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar9 = this->FRN;
    }
    uVar8 = v_t[iVar9] - *accessor->median;
    if ((int)uVar8 < 1) {
      uVar8 = -uVar8;
    }
    bVar4 = TryCast::Operation<int,int>(uVar8,&local_44,false);
    iVar3 = local_44;
    if (!bVar4) {
      auVar10 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_40,(duckdb *)(ulong)uVar8,auVar10._8_4_);
      InvalidInputException::InvalidInputException(auVar10._0_8_,&local_40);
      __cxa_throw(auVar10._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    uVar8 = v_t[this->CRN] - *accessor->median;
    if ((int)uVar8 < 1) {
      uVar8 = -uVar8;
    }
    bVar4 = TryCast::Operation<int,int>(uVar8,&local_44,false);
    if (!bVar4) {
      auVar10 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_40,(duckdb *)(ulong)uVar8,auVar10._8_4_);
      InvalidInputException::InvalidInputException(auVar10._0_8_,&local_40);
      __cxa_throw(auVar10._0_8_,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    local_44 = (int)((double)(local_44 - iVar3) *
                     (this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                    (double)iVar3);
  }
  return local_44;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}